

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplingManager.cpp
# Opt level: O1

ssize_t __thiscall
jaegertracing::sampling_manager::thrift::SamplingManager_getSamplingStrategy_result::write
          (SamplingManager_getSamplingStrategy_result *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long *plVar5;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (**(code **)(*plVar5 + 0x20))(plVar5,"SamplingManager_getSamplingStrategy_result");
  if (((byte)this->__isset & 1) != 0) {
    __n_00 = 0;
    iVar2 = (**(code **)(*plVar5 + 0x30))(plVar5,"success",0xc);
    sVar4 = SamplingStrategyResponse::write(&this->success,__fd,__buf_00,__n_00);
    iVar3 = (**(code **)(*plVar5 + 0x38))(plVar5);
    iVar1 = iVar3 + (int)sVar4 + iVar2 + iVar1;
  }
  iVar2 = (**(code **)(*plVar5 + 0x40))(plVar5);
  iVar3 = (**(code **)(*plVar5 + 0x28))(plVar5);
  return (ulong)(uint)(iVar3 + iVar2 + iVar1);
}

Assistant:

uint32_t SamplingManager_getSamplingStrategy_result::write(::apache::thrift::protocol::TProtocol* oprot) const {

  uint32_t xfer = 0;

  xfer += oprot->writeStructBegin("SamplingManager_getSamplingStrategy_result");

  if (this->__isset.success) {
    xfer += oprot->writeFieldBegin("success", ::apache::thrift::protocol::T_STRUCT, 0);
    xfer += this->success.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}